

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  cmConditionEvaluator *pcVar5;
  cmConditionEvaluator *pcVar6;
  string *psVar7;
  char *pcVar8;
  ostream *poVar9;
  size_t sVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  PolicyID id;
  _Self __tmp_1;
  cmConditionEvaluator *this_00;
  cmMakefile *pcVar12;
  _Self __tmp;
  iterator iVar13;
  iterator iVar14;
  _Self __tmp_2;
  cmExpandedCommandArgument *pcVar15;
  cmExpandedCommandArgument *argument;
  iterator argP2;
  int reducible;
  iterator arg;
  char *def;
  string def_buf;
  RegularExpression regEntry;
  ostringstream error;
  iterator local_2f8;
  int local_2ec;
  iterator local_2e8;
  iterator local_2e0;
  cmConditionEvaluator *local_2d8;
  string local_2d0;
  _List_node_base *local_2b0;
  cmConditionEvaluator *local_2a8;
  char *local_2a0;
  undefined1 local_298 [32];
  undefined1 local_278 [184];
  char *local_1c0;
  undefined1 local_1a8 [32];
  bool local_188;
  ios_base local_138 [264];
  
  local_2a8 = (cmConditionEvaluator *)local_298;
  local_2a0 = (char *)0x0;
  local_298[0] = 0;
  local_298._16_8_ = errorString;
  local_298._24_8_ = status;
  while( true ) {
    local_2ec = 0;
    local_2e0._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_2f8._M_node = (_List_node_base *)0x0;
    if (local_2e0._M_node == (_List_node_base *)newArgs) break;
    do {
      local_2e8._M_node = local_2e0._M_node;
      if ((local_2e0._M_node != (_List_node_base *)newArgs) &&
         (local_2e8._M_node = (local_2e0._M_node)->_M_next, local_2f8._M_node = local_2e8._M_node,
         local_2e8._M_node != (_List_node_base *)newArgs)) {
        local_2f8._M_node = (local_2e8._M_node)->_M_next;
      }
      iVar14._M_node = local_2e8._M_node;
      iVar13._M_node = local_2f8._M_node;
      if (((local_2e8._M_node != (_List_node_base *)newArgs) &&
          (local_2f8._M_node != (_List_node_base *)newArgs)) &&
         (bVar2 = IsKeyword(this,&keyMATCHES_abi_cxx11_,
                            (cmExpandedCommandArgument *)(local_2e8._M_node + 1)), bVar2)) {
        local_2b0 = local_2e0._M_node;
        pcVar15 = (cmExpandedCommandArgument *)(local_2e0._M_node + 1);
        pcVar5 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,pcVar15);
        if (pcVar5 == (cmConditionEvaluator *)0x0) {
          pcVar5 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar15);
        }
        local_2d8 = pcVar5;
        pcVar6 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar15);
        if (pcVar5 != pcVar6) {
          psVar7 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar15);
          iVar4 = strncmp((psVar7->_M_dataplus)._M_p,"CMAKE_MATCH_",0xc);
          pcVar8 = local_2a0;
          pcVar5 = local_2d8;
          if (iVar4 == 0) {
            strlen((char *)local_2d8);
            std::__cxx11::string::_M_replace((ulong)&local_2a8,0,pcVar8,(ulong)pcVar5);
            local_2d8 = local_2a8;
          }
        }
        pcVar8 = cmExpandedCommandArgument::c_str((cmExpandedCommandArgument *)(iVar13._M_node + 1))
        ;
        cmMakefile::ClearMatches(this->Makefile);
        local_1c0 = (char *)0x0;
        bVar2 = cmsys::RegularExpression::compile((RegularExpression *)local_278,pcVar8);
        if (bVar2) {
          bVar3 = cmsys::RegularExpression::find((RegularExpression *)local_278,(char *)local_2d8);
          if (bVar3) {
            cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_278);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"1","");
            cmExpandedCommandArgument::cmExpandedCommandArgument
                      ((cmExpandedCommandArgument *)local_1a8,&local_2d0,true);
          }
          else {
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"0","");
            cmExpandedCommandArgument::cmExpandedCommandArgument
                      ((cmExpandedCommandArgument *)local_1a8,&local_2d0,true);
          }
          std::__cxx11::string::operator=((string *)pcVar15,(string *)local_1a8);
          p_Var1 = local_2b0;
          *(bool *)&local_2b0[3]._M_next = local_188;
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar13);
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar14);
          local_2e8._M_node = p_Var1;
          if ((p_Var1 != (_List_node_base *)newArgs) &&
             (local_2e8._M_node = p_Var1->_M_next, local_2f8._M_node = local_2e8._M_node,
             local_2e8._M_node != (_List_node_base *)newArgs)) {
            local_2f8._M_node = (local_2e8._M_node)->_M_next;
          }
          local_2ec = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Regular expression \"",0x14);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffce8 +
                            (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x170);
          }
          else {
            sVar10 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\" cannot compile",0x10);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_298._16_8_,(string *)&local_2d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          *(MessageType *)local_298._24_8_ = FATAL_ERROR;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        if (local_1c0 != (char *)0x0) {
          operator_delete__(local_1c0);
        }
        if (!bVar2) {
          bVar2 = false;
          goto LAB_00431187;
        }
      }
      iVar14._M_node = local_2e0._M_node;
      iVar13._M_node = local_2e8._M_node;
      if (local_2e8._M_node != (_List_node_base *)newArgs) {
        pcVar15 = (cmExpandedCommandArgument *)(local_2e0._M_node + 1);
        bVar2 = IsKeyword(this,&keyMATCHES_abi_cxx11_,pcVar15);
        if (bVar2) {
          local_278._0_8_ = local_278 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"0","");
          cmExpandedCommandArgument::cmExpandedCommandArgument
                    ((cmExpandedCommandArgument *)local_1a8,(string *)local_278,true);
          std::__cxx11::string::operator=((string *)pcVar15,(string *)local_1a8);
          *(bool *)&iVar14._M_node[3]._M_next = local_188;
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
          }
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar13);
          local_2e8._M_node = iVar14._M_node;
          if ((iVar14._M_node != (_List_node_base *)newArgs) &&
             (local_2e8._M_node = (iVar14._M_node)->_M_next, local_2f8._M_node = local_2e8._M_node,
             local_2e8._M_node != (_List_node_base *)newArgs)) {
            local_2f8._M_node = (local_2e8._M_node)->_M_next;
          }
          local_2ec = 1;
          iVar13._M_node = local_2e8._M_node;
        }
      }
      iVar14._M_node = local_2f8._M_node;
      if ((iVar13._M_node != (_List_node_base *)newArgs) &&
         (local_2f8._M_node != (_List_node_base *)newArgs)) {
        pcVar5 = (cmConditionEvaluator *)(iVar13._M_node + 1);
        bVar2 = IsKeyword(this,&keyLESS_abi_cxx11_,(cmExpandedCommandArgument *)pcVar5);
        if ((bVar2) ||
           ((((bVar2 = IsKeyword(this,&keyLESS_EQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar5)
              , bVar2 ||
              (bVar2 = IsKeyword(this,&keyGREATER_abi_cxx11_,(cmExpandedCommandArgument *)pcVar5),
              bVar2)) ||
             (bVar2 = IsKeyword(this,&keyGREATER_EQUAL_abi_cxx11_,
                                (cmExpandedCommandArgument *)pcVar5), bVar2)) ||
            (bVar2 = IsKeyword(this,&keyEQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar5), bVar2
            )))) {
          pcVar15 = (cmExpandedCommandArgument *)(local_2e0._M_node + 1);
          pcVar6 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,pcVar15);
          if (pcVar6 == (cmConditionEvaluator *)0x0) {
            pcVar6 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar15);
          }
          local_2d8 = pcVar6;
          pcVar6 = (cmConditionEvaluator *)
                   GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar14._M_node + 1));
          if (pcVar6 == (cmConditionEvaluator *)0x0) {
            pcVar6 = (cmConditionEvaluator *)
                     cmExpandedCommandArgument::c_str
                               ((cmExpandedCommandArgument *)(iVar14._M_node + 1));
          }
          bVar2 = false;
          this_00 = local_2d8;
          iVar4 = __isoc99_sscanf(local_2d8,"%lg",local_1a8);
          if (iVar4 == 1) {
            bVar2 = false;
            iVar4 = __isoc99_sscanf(pcVar6,"%lg",local_278);
            this_00 = pcVar6;
            if (iVar4 == 1) {
              this_00 = pcVar5;
              bVar2 = cmExpandedCommandArgument::operator==
                                ((cmExpandedCommandArgument *)pcVar5,&keyLESS_abi_cxx11_);
              if (bVar2) {
                bVar2 = (double)local_278._0_8_ == (double)local_1a8._0_8_;
                bVar3 = (double)local_278._0_8_ < (double)local_1a8._0_8_;
LAB_00430a6f:
                bVar2 = !bVar3 && !bVar2;
              }
              else {
                pcVar6 = pcVar5;
                bVar2 = cmExpandedCommandArgument::operator==
                                  ((cmExpandedCommandArgument *)pcVar5,&keyLESS_EQUAL_abi_cxx11_);
                if (bVar2) {
                  bVar2 = (double)local_278._0_8_ < (double)local_1a8._0_8_;
                  pcVar5 = pcVar6;
                }
                else {
                  this_00 = pcVar5;
                  bVar2 = cmExpandedCommandArgument::operator==
                                    ((cmExpandedCommandArgument *)pcVar5,&keyGREATER_abi_cxx11_);
                  if (bVar2) {
                    bVar2 = (double)local_1a8._0_8_ == (double)local_278._0_8_;
                    bVar3 = (double)local_1a8._0_8_ < (double)local_278._0_8_;
                    goto LAB_00430a6f;
                  }
                  bVar2 = cmExpandedCommandArgument::operator==
                                    ((cmExpandedCommandArgument *)pcVar5,
                                     &keyGREATER_EQUAL_abi_cxx11_);
                  if (!bVar2) {
                    bVar2 = (bool)(-((double)local_1a8._0_8_ == (double)local_278._0_8_) & 1);
                    this_00 = pcVar5;
                    goto LAB_00430aa0;
                  }
                  bVar2 = (double)local_1a8._0_8_ < (double)local_278._0_8_;
                }
                bVar2 = !bVar2;
                this_00 = pcVar5;
              }
            }
          }
LAB_00430aa0:
          HandleBinaryOp(this_00,bVar2,&local_2ec,&local_2e0,newArgs,&local_2e8,&local_2f8);
        }
      }
      iVar14._M_node = local_2e8._M_node;
      iVar13._M_node = local_2f8._M_node;
      if ((local_2e8._M_node != (_List_node_base *)newArgs) &&
         (local_2f8._M_node != (_List_node_base *)newArgs)) {
        pcVar5 = (cmConditionEvaluator *)(local_2e8._M_node + 1);
        bVar2 = IsKeyword(this,&keySTRLESS_abi_cxx11_,(cmExpandedCommandArgument *)pcVar5);
        if ((((bVar2) ||
             ((bVar2 = IsKeyword(this,&keySTRLESS_EQUAL_abi_cxx11_,
                                 (cmExpandedCommandArgument *)pcVar5), bVar2 ||
              (bVar2 = IsKeyword(this,&keySTRGREATER_abi_cxx11_,(cmExpandedCommandArgument *)pcVar5)
              , bVar2)))) ||
            (bVar2 = IsKeyword(this,&keySTRGREATER_EQUAL_abi_cxx11_,
                               (cmExpandedCommandArgument *)pcVar5), bVar2)) ||
           (bVar2 = IsKeyword(this,&keySTREQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar5),
           bVar2)) {
          pcVar15 = (cmExpandedCommandArgument *)(local_2e0._M_node + 1);
          pcVar6 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,pcVar15);
          if (pcVar6 == (cmConditionEvaluator *)0x0) {
            pcVar6 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar15);
          }
          local_2d8 = pcVar6;
          pcVar8 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar13._M_node + 1));
          if (pcVar8 == (char *)0x0) {
            pcVar8 = cmExpandedCommandArgument::c_str
                               ((cmExpandedCommandArgument *)(iVar13._M_node + 1));
          }
          iVar4 = strcmp((char *)local_2d8,pcVar8);
          pcVar6 = pcVar5;
          bVar2 = cmExpandedCommandArgument::operator==
                            ((cmExpandedCommandArgument *)pcVar5,&keySTRLESS_abi_cxx11_);
          if (bVar2) {
            bVar2 = SUB41((uint)iVar4 >> 0x1f,0);
            pcVar5 = pcVar6;
          }
          else {
            pcVar6 = pcVar5;
            bVar2 = cmExpandedCommandArgument::operator==
                              ((cmExpandedCommandArgument *)pcVar5,&keySTRLESS_EQUAL_abi_cxx11_);
            if (bVar2) {
              bVar2 = iVar4 < 1;
              pcVar5 = pcVar6;
            }
            else {
              pcVar6 = pcVar5;
              bVar2 = cmExpandedCommandArgument::operator==
                                ((cmExpandedCommandArgument *)pcVar5,&keySTRGREATER_abi_cxx11_);
              if (bVar2) {
                bVar2 = 0 < iVar4;
                pcVar5 = pcVar6;
              }
              else {
                bVar2 = cmExpandedCommandArgument::operator==
                                  ((cmExpandedCommandArgument *)pcVar5,
                                   &keySTRGREATER_EQUAL_abi_cxx11_);
                if (bVar2) {
                  bVar2 = -1 < iVar4;
                }
                else {
                  bVar2 = iVar4 == 0;
                }
              }
            }
          }
          HandleBinaryOp(pcVar5,bVar2,&local_2ec,&local_2e0,newArgs,&local_2e8,&local_2f8);
          iVar14._M_node = local_2e8._M_node;
        }
      }
      iVar13._M_node = local_2f8._M_node;
      if ((iVar14._M_node != (_List_node_base *)newArgs) &&
         (local_2f8._M_node != (_List_node_base *)newArgs)) {
        pcVar15 = (cmExpandedCommandArgument *)(iVar14._M_node + 1);
        bVar2 = IsKeyword(this,&keyVERSION_LESS_abi_cxx11_,pcVar15);
        if (((bVar2) ||
            (((bVar2 = IsKeyword(this,&keyVERSION_LESS_EQUAL_abi_cxx11_,pcVar15), bVar2 ||
              (bVar2 = IsKeyword(this,&keyVERSION_GREATER_abi_cxx11_,pcVar15), bVar2)) ||
             (bVar2 = IsKeyword(this,&keyVERSION_GREATER_EQUAL_abi_cxx11_,pcVar15), bVar2)))) ||
           (bVar2 = IsKeyword(this,&keyVERSION_EQUAL_abi_cxx11_,pcVar15), bVar2)) {
          argument = (cmExpandedCommandArgument *)(local_2e0._M_node + 1);
          pcVar5 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,argument);
          if (pcVar5 == (cmConditionEvaluator *)0x0) {
            pcVar5 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(argument);
          }
          local_2d8 = pcVar5;
          pcVar8 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar13._M_node + 1));
          if (pcVar8 == (char *)0x0) {
            pcVar8 = cmExpandedCommandArgument::c_str
                               ((cmExpandedCommandArgument *)(iVar13._M_node + 1));
          }
          bVar2 = cmExpandedCommandArgument::operator==(pcVar15,&keyVERSION_LESS_abi_cxx11_);
          pcVar5 = (cmConditionEvaluator *)0x2;
          if (!bVar2) {
            bVar2 = cmExpandedCommandArgument::operator==(pcVar15,&keyVERSION_LESS_EQUAL_abi_cxx11_)
            ;
            pcVar5 = (cmConditionEvaluator *)0x3;
            if (!bVar2) {
              bVar2 = cmExpandedCommandArgument::operator==(pcVar15,&keyVERSION_GREATER_abi_cxx11_);
              pcVar5 = (cmConditionEvaluator *)0x4;
              if (!bVar2) {
                bVar2 = cmExpandedCommandArgument::operator==
                                  (pcVar15,&keyVERSION_GREATER_EQUAL_abi_cxx11_);
                pcVar5 = (cmConditionEvaluator *)(ulong)((uint)bVar2 * 4 + 1);
              }
            }
          }
          bVar2 = cmSystemTools::VersionCompare((CompareOp)pcVar5,(char *)local_2d8,pcVar8);
          HandleBinaryOp(pcVar5,bVar2,&local_2ec,&local_2e0,newArgs,&local_2e8,&local_2f8);
        }
      }
      iVar14._M_node = local_2e8._M_node;
      iVar13._M_node = local_2f8._M_node;
      if (((local_2e8._M_node != (_List_node_base *)newArgs) &&
          (local_2f8._M_node != (_List_node_base *)newArgs)) &&
         (bVar2 = IsKeyword(this,&keyIS_NEWER_THAN_abi_cxx11_,
                            (cmExpandedCommandArgument *)(local_2e8._M_node + 1)), bVar2)) {
        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
        pcVar5 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(local_2e0._M_node + 1));
        psVar7 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(iVar13._M_node + 1));
        bVar2 = cmsys::SystemTools::FileTimeCompare((string *)pcVar5,psVar7,(int *)local_1a8);
        HandleBinaryOp(pcVar5,(uint)local_1a8._0_4_ < 2 || !bVar2,&local_2ec,&local_2e0,newArgs,
                       &local_2e8,&local_2f8);
        iVar14._M_node = local_2e8._M_node;
      }
      iVar13._M_node = local_2f8._M_node;
      if (((iVar14._M_node != (_List_node_base *)newArgs) &&
          (local_2f8._M_node != (_List_node_base *)newArgs)) &&
         (bVar2 = IsKeyword(this,&keyIN_LIST_abi_cxx11_,
                            (cmExpandedCommandArgument *)(iVar14._M_node + 1)), bVar2)) {
        if (this->Policy57Status < NEW) {
          if (this->Policy57Status == WARN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_278,(cmPolicies *)0x39,id);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_278._0_8_,local_278._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "IN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       ,0x85);
            pcVar12 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar12,AUTHOR_WARNING,(string *)local_278);
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
        }
        else {
          pcVar15 = (cmExpandedCommandArgument *)(local_2e0._M_node + 1);
          pcVar5 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,pcVar15);
          if (pcVar5 == (cmConditionEvaluator *)0x0) {
            pcVar5 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar15);
          }
          pcVar12 = this->Makefile;
          local_2d8 = pcVar5;
          psVar7 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                             ((cmExpandedCommandArgument *)(iVar13._M_node + 1));
          pcVar8 = cmMakefile::GetDefinition(pcVar12,psVar7);
          if (pcVar8 == (char *)0x0) {
            bVar2 = false;
          }
          else {
            local_278._0_8_ = (char *)0x0;
            local_278._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_278._16_8_ = (char *)0x0;
            local_1a8._0_8_ = local_1a8 + 0x10;
            sVar10 = strlen(pcVar8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,pcVar8,pcVar8 + sVar10);
            cmSystemTools::ExpandListArgument
                      ((string *)local_1a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_278,true);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            _Var11 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                               (local_278._0_8_,local_278._8_8_,&local_2d8);
            bVar2 = _Var11._M_current !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_278._8_8_;
            pcVar12 = (cmMakefile *)local_278;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pcVar12);
          }
          HandleBinaryOp((cmConditionEvaluator *)pcVar12,bVar2,&local_2ec,&local_2e0,newArgs,
                         &local_2e8,&local_2f8);
        }
      }
      local_2e0._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &(local_2e0._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (local_2e0._M_node != (_List_node_base *)newArgs);
    if (local_2ec == 0) break;
  }
  bVar2 = true;
LAB_00431187:
  if (local_2a8 != (cmConditionEvaluator *)local_298) {
    operator_delete(local_2a8,CONCAT71(local_298._1_7_,local_298[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        cmake::MessageType& status)
{
  int reducible;
  std::string def_buf;
  const char* def;
  const char* def2;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      this->IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          IsKeyword(keyMATCHES, *argP1)) {
        def = this->GetVariableOrString(*arg);
        if (def != arg->c_str() // yes, we compare the pointer value
            && cmHasLiteralPrefix(arg->GetValue(), "CMAKE_MATCH_")) {
          // The string to match is owned by our match result variables.
          // Move it to our own buffer before clearing them.
          def_buf = def;
          def = def_buf.c_str();
        }
        const char* rex = argP2->c_str();
        this->Makefile.ClearMatches();
        cmsys::RegularExpression regEntry;
        if (!regEntry.compile(rex)) {
          std::ostringstream error;
          error << "Regular expression \"" << rex << "\" cannot compile";
          errorString = error.str();
          status = cmake::FATAL_ERROR;
          return false;
        }
        if (regEntry.find(def)) {
          this->Makefile.StoreMatches(regEntry);
          *arg = cmExpandedCommandArgument("1", true);
        } else {
          *arg = cmExpandedCommandArgument("0", true);
        }
        newArgs.erase(argP2);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && this->IsKeyword(keyMATCHES, *arg)) {
        *arg = cmExpandedCommandArgument("0", true);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyLESS, *argP1) ||
           this->IsKeyword(keyLESS_EQUAL, *argP1) ||
           this->IsKeyword(keyGREATER, *argP1) ||
           this->IsKeyword(keyGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyEQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        double lhs;
        double rhs;
        bool result;
        if (sscanf(def, "%lg", &lhs) != 1 || sscanf(def2, "%lg", &rhs) != 1) {
          result = false;
        } else if (*(argP1) == keyLESS) {
          result = (lhs < rhs);
        } else if (*(argP1) == keyLESS_EQUAL) {
          result = (lhs <= rhs);
        } else if (*(argP1) == keyGREATER) {
          result = (lhs > rhs);
        } else if (*(argP1) == keyGREATER_EQUAL) {
          result = (lhs >= rhs);
        } else {
          result = (lhs == rhs);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keySTRLESS, *argP1) ||
           this->IsKeyword(keySTRLESS_EQUAL, *argP1) ||
           this->IsKeyword(keySTRGREATER, *argP1) ||
           this->IsKeyword(keySTRGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keySTREQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        int val = strcmp(def, def2);
        bool result;
        if (*(argP1) == keySTRLESS) {
          result = (val < 0);
        } else if (*(argP1) == keySTRLESS_EQUAL) {
          result = (val <= 0);
        } else if (*(argP1) == keySTRGREATER) {
          result = (val > 0);
        } else if (*(argP1) == keySTRGREATER_EQUAL) {
          result = (val >= 0);
        } else // strequal
        {
          result = (val == 0);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyVERSION_LESS, *argP1) ||
           this->IsKeyword(keyVERSION_LESS_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_EQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        cmSystemTools::CompareOp op;
        if (*argP1 == keyVERSION_LESS) {
          op = cmSystemTools::OP_LESS;
        } else if (*argP1 == keyVERSION_LESS_EQUAL) {
          op = cmSystemTools::OP_LESS_EQUAL;
        } else if (*argP1 == keyVERSION_GREATER) {
          op = cmSystemTools::OP_GREATER;
        } else if (*argP1 == keyVERSION_GREATER_EQUAL) {
          op = cmSystemTools::OP_GREATER_EQUAL;
        } else { // version_equal
          op = cmSystemTools::OP_EQUAL;
        }
        bool result = cmSystemTools::VersionCompare(op, def, def2);
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      // is file A newer than file B
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIS_NEWER_THAN, *argP1)) {
        int fileIsNewer = 0;
        bool success = cmSystemTools::FileTimeCompare(
          arg->GetValue(), (argP2)->GetValue(), &fileIsNewer);
        this->HandleBinaryOp(
          (!success || fileIsNewer == 1 || fileIsNewer == 0), reducible, arg,
          newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIN_LIST, *argP1)) {
        if (this->Policy57Status != cmPolicies::OLD &&
            this->Policy57Status != cmPolicies::WARN) {
          bool result = false;

          def = this->GetVariableOrString(*arg);
          def2 = this->Makefile.GetDefinition(argP2->GetValue());

          if (def2) {
            std::vector<std::string> list;
            cmSystemTools::ExpandListArgument(def2, list, true);

            result = std::find(list.begin(), list.end(), def) != list.end();
          }

          this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
        } else if (this->Policy57Status == cmPolicies::WARN) {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057) << "\n";
          e << "IN_LIST will be interpreted as an operator "
               "when the policy is set to NEW.  "
               "Since the policy is not set the OLD behavior will be used.";

          this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      }

      ++arg;
    }
  } while (reducible);
  return true;
}